

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SWRaster.cpp
# Opt level: O0

void __thiscall TRM::SWRaster::render_quad_to(SWRaster *this,float cx,float cy,float x2,float y2)

{
  int32_t iVar1;
  int iVar2;
  pointer pvVar3;
  value_type_conflict vVar4;
  int local_4c;
  int32_t dy;
  int32_t dx;
  int32_t top;
  int32_t y;
  int32_t max;
  int32_t min;
  size_t level;
  pointer arc;
  pointer levels;
  float y2_local;
  float x2_local;
  float cy_local;
  float cx_local;
  SWRaster *this_local;
  
  pvVar3 = std::array<unsigned_long,_32UL>::data(&this->m_lev_stack);
  level = (size_t)std::array<glm::vec<2,_int,_(glm::qualifier)0>,_97UL>::data(&this->m_bez_stack);
  iVar1 = up_scale<float>(x2);
  (((pointer)level)->field_0).x = iVar1;
  iVar1 = up_scale<float>(y2);
  (((pointer)level)->field_1).y = iVar1;
  iVar1 = up_scale<float>(cx);
  (((pointer)(level + 8))->field_0).x = iVar1;
  iVar1 = up_scale<float>(cy);
  (((pointer)(level + 8))->field_1).y = iVar1;
  ((pointer)(level + 0x10))->field_0 =
       (anon_union_4_3_4e90da17_for_vec<2,_int,_(glm::qualifier)0>_3)this->m_x;
  ((pointer)(level + 0x10))->field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<2,_int,_(glm::qualifier)0>_5)this->m_y;
  dy = 0;
  local_4c = (((pointer)(level + 0x10))->field_0).x + (((pointer)level)->field_0).x +
             (((pointer)(level + 8))->field_0).x * -2;
  if (local_4c < 1) {
    local_4c = -local_4c;
  }
  iVar2 = (((pointer)(level + 0x10))->field_1).y + (((pointer)level)->field_1).y +
          (((pointer)(level + 8))->field_1).y * -2;
  if (iVar2 < 1) {
    iVar2 = -iVar2;
  }
  if (local_4c < iVar2) {
    local_4c = iVar2;
  }
  if (local_4c < 0x40) goto LAB_00123f9b;
  _max = 0;
  do {
    local_4c = local_4c >> 2;
    _max = _max + 1;
  } while (0x40 < local_4c);
  *pvVar3 = _max;
  do {
    vVar4 = pvVar3[dy];
    if (vVar4 == 0) {
LAB_00123f9b:
      render_line(this,*(int32_t *)level,*(int32_t *)(level + 4));
      level = level - 0x10;
      dy = dy + -1;
    }
    else {
      sw_split_conic((Vec2i *)level);
      level = level + 0x10;
      vVar4 = vVar4 - 1;
      pvVar3[dy] = vVar4;
      pvVar3[dy + 1] = vVar4;
      dy = dy + 1;
    }
  } while (-1 < dy);
  return;
}

Assistant:

void SWRaster::render_quad_to(float cx, float cy, float x2, float y2) {
  auto levels = m_lev_stack.data();
  auto arc = m_bez_stack.data();
  size_t level = 0;
  int32_t min, max, y;

  arc[0].x = up_scale(x2);
  arc[0].y = up_scale(y2);
  arc[1].x = up_scale(cx);
  arc[1].y = up_scale(cy);
  arc[2].x = m_x;
  arc[2].y = m_y;
  int32_t top = 0;

  int32_t dx = std::abs(arc[2].x + arc[0].x - 2 * arc[1].x);
  int32_t dy = std::abs(arc[2].y + arc[0].y - 2 * arc[1].y);

  if (dx < dy) {
    dx = dy;
  }

  if (dx < ONE_PIXEL / 4) {
    goto DRAW;
  }

  level = 0;
  do {
    dx >>= 2;
    level++;
  } while (dx > ONE_PIXEL / 4);

  levels[0] = level;

  do {
    level = levels[top];
    if (level > 0) {
      sw_split_conic(arc);
      arc += 2;
      top++;
      levels[top] = levels[top - 1] = level - 1;
      continue;
    }
  DRAW:
    render_line(arc[0].x, arc[0].y);
    top--;
    arc -= 2;
  } while (top >= 0);
}